

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall
Diffusion::diffuse_scalar
          (Diffusion *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_new,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_new,int S_comp,
          int nComp,int Rho_comp,Real prev_time,Real curr_time,Real be_cn_theta,MultiFab *rho_half,
          int rho_flag,MultiFab **fluxn,MultiFab **fluxnp1,int fluxComp,MultiFab *delta_rhs,
          int rhsComp,MultiFab *alpha_in,int alpha_in_comp,MultiFab **betan,MultiFab **betanp1,
          int betaComp,IntVect *cratio,BCRec *bc,Geometry *geom,bool add_old_time_divFlux,
          Vector<int,_std::allocator<int>_> *a_is_diffusive)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  ostringstream *poVar1;
  pointer ppMVar2;
  __uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
  factory;
  void *pvVar3;
  Real a_tol_rel;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *pFVar4;
  double *pdVar5;
  MultiFab *pMVar6;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar7;
  long lVar8;
  int idim_1;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Diffusion *pDVar13;
  long lVar14;
  long lVar15;
  undefined4 in_register_0000008c;
  long lVar16;
  _func_int ***ppp_Var17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  ulong uVar22;
  long lVar23;
  BoxArray *pBVar24;
  int idim;
  double *pdVar25;
  long lVar26;
  bool bVar27;
  double dVar28;
  Real a_tol_abs;
  double dVar29;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<amrex::Geometry> __l_03;
  initializer_list<amrex::BoxArray> __l_04;
  initializer_list<amrex::DistributionMapping> __l_05;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_06;
  initializer_list<amrex::MultiFab_*> __l_07;
  initializer_list<amrex::MultiFab_*> __l_08;
  initializer_list<amrex::MultiFab_*> __l_09;
  initializer_list<const_amrex::MultiFab_*> __l_10;
  pair<double,_double> scalars;
  int allnull;
  Real rhsscale;
  int allthere;
  MultiFab rhs_tmp;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  MultiFab Soln;
  MLMG mgnp1;
  MLEBABecLap opn;
  MLMG mgn;
  MultiFab Rhs;
  MLEBABecLap opnp1;
  DistributionMapping *local_13f0;
  long local_13e8;
  ulong local_13e0;
  long local_1388;
  undefined1 local_1348 [24];
  pointer pbStack_1330;
  undefined8 local_1328;
  int local_1320;
  undefined8 local_1300;
  FabArray<amrex::FArrayBox> *local_12f8;
  int local_12f0;
  allocator_type local_12ea;
  allocator_type local_12e9;
  Array4<const_double> local_12e8;
  Real local_12a8;
  long local_12a0;
  long local_1298;
  long local_1290;
  FabArray<amrex::FArrayBox> *local_1288;
  Array4<double> local_1280;
  long local_1240;
  double *local_1238;
  int local_122c;
  Array4<const_double> local_1228;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_11e8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_11e0;
  int local_11d4;
  MultiFab *local_11d0;
  Diffusion *local_11c8;
  long local_11c0;
  Array4<const_double> local_11b8;
  Box local_116c;
  double local_1150;
  ulong local_1148;
  long local_1140;
  long local_1138;
  long local_1130;
  long local_1128;
  ulong local_1120;
  long local_1118;
  long local_1110;
  long local_1108;
  double *local_1100;
  long local_10f8;
  long local_10f0;
  long local_10e8;
  long local_10e0;
  long local_10d8;
  long local_10d0;
  long local_10c8;
  long local_10c0;
  long local_10b8;
  long local_10b0;
  long local_10a8;
  long local_10a0;
  long local_1098;
  FabArray<amrex::FArrayBox> *local_1090;
  long local_1088;
  long local_1080;
  LPInfo local_1074;
  int local_1054;
  undefined1 local_1050 [204];
  int local_f84;
  LPInfo local_ec8;
  Array4<const_double> local_ea8;
  Array4<const_double> local_e68;
  array<amrex::LinOpBCType,_3UL> local_e28;
  array<amrex::LinOpBCType,_3UL> local_e1c;
  FabArray<amrex::FArrayBox> local_e10;
  undefined1 local_c90 [28];
  int local_c74;
  undefined1 local_af8 [8];
  Arena *pAStack_af0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ae8;
  int local_acc;
  MLMG local_720;
  FabArray<amrex::FArrayBox> local_588;
  MLEBABecLap local_408;
  
  local_1300 = CONCAT44(in_register_0000008c,S_comp);
  local_12a8 = be_cn_theta;
  local_11e8 = Rho_new;
  local_11e0 = Rho_old;
  if (verbose != 0) {
    pAStack_af0 = (Arena *)amrex::OutStream();
    local_af8._4_4_ = *(MPI_Comm *)(DAT_00842950 + -0x48);
    local_af8._0_4_ = *(int *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_ae8);
    *(undefined8 *)
     ((long)&local_ae8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     local_ae8.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((long)&(pAStack_af0->arena_info).release_threshold + (long)pAStack_af0->_vptr_Arena[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_ae8,"... Diffusion::diffuse_scalar(): \n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_ae8," lev: ",6);
    std::ostream::operator<<((ostringstream *)&local_ae8,this->level);
    local_408.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_ae8,(char *)&local_408,1);
    amrex::Print::~Print((Print *)local_af8);
  }
  local_11c8 = this;
  if (0 < (int)local_1300 + nComp && (int)local_1300 < 1) {
    amrex::Abort_host(
                     "Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n"
                     );
  }
  iVar9 = *(a_is_diffusive->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (1 < nComp) {
    uVar22 = 1;
    do {
      if ((a_is_diffusive->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar22] != iVar9) {
        amrex::Abort_host(
                         "All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar"
                         );
      }
      uVar22 = uVar22 + 1;
    } while ((uint)nComp != uVar22);
  }
  if (iVar9 == 0) {
    lVar16 = 0;
    do {
      if ((&fluxn[lVar16]->super_FabArray<amrex::FArrayBox> != (FabArray<amrex::FArrayBox> *)0x0) &&
         (fluxnp1[lVar16] != (MultiFab *)0x0)) {
        local_af8 = (undefined1  [8])0x0;
        pAStack_af0 = (Arena *)((ulong)pAStack_af0 & 0xffffffff00000000);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxn[lVar16]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,
                   (IntVect *)local_af8);
        local_af8 = (undefined1  [8])0x0;
        pAStack_af0 = (Arena *)((ulong)pAStack_af0 & 0xffffffff00000000);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxnp1[lVar16]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,
                   (IntVect *)local_af8);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
  }
  else {
    local_1240 = (long)(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    local_1150 = amrex::ParallelDescriptor::second();
    pDVar13 = (Diffusion *)betan;
    checkBeta(betan,&local_1054,&local_11d4);
    checkBeta(pDVar13,betanp1,&local_1054);
    bVar27 = local_12a8 != 1.0;
    if ((bVar27 && add_old_time_divFlux) && (local_11d4 != 0)) {
      amrex::Abort_host(
                       "Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta."
                       );
    }
    ppMVar2 = (S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar6 = *ppMVar2;
    if (local_1240 < 9) {
      local_13f0 = (DistributionMapping *)0x0;
    }
    else {
      local_13f0 = &(ppMVar2[1]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                    distributionMap;
    }
    bxs = &(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    dm = &(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
    if (local_1240 < 9) {
      pBVar24 = (BoxArray *)0x0;
    }
    else {
      pBVar24 = &(ppMVar2[1]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    }
    factory.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (pMVar6->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ;
    local_af8 = (undefined1  [8])0x1;
    pAStack_af0 = (Arena *)0x0;
    local_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_588,bxs,dm,nComp,0,(MFInfo *)local_af8,
               (FabFactory<amrex::FArrayBox> *)
               factory.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ae8);
    local_af8 = (undefined1  [8])0x1;
    pAStack_af0 = (Arena *)0x0;
    local_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_ae8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_e10,bxs,dm,nComp,1,(MFInfo *)local_af8,
               (FabFactory<amrex::FArrayBox> *)
               factory.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ae8);
    this_00 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    amrex::MultiFab::MultiFab((MultiFab *)this_00);
    if (8 < local_1240) {
      local_af8 = (undefined1  [8])0x1;
      pAStack_af0 = (Arena *)0x0;
      local_ae8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_ae8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_ae8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[2])
                (this_00,pBVar24,local_13f0,(ulong)(uint)nComp,0,local_af8,
                 (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  )((S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>).
                   m_factory._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_ae8);
    }
    local_ec8.do_semicoarsening = false;
    local_ec8.agg_grid_size = -1;
    local_ec8.con_grid_size = -1;
    local_ec8.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_ec8.has_metric_term = true;
    local_ec8.do_consolidation = (anonymous_namespace)::consolidation != 0;
    local_ec8.max_coarsening_level = 0;
    local_ec8.max_semicoarsening_level = 0;
    local_ec8.semicoarsening_direction = -1;
    local_ec8.hidden_direction = -1;
    pFVar4 = (FabArray<amrex::FArrayBox> *)
             __dynamic_cast(factory.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (pFVar4 == (FabArray<amrex::FArrayBox> *)0x0) {
      __cxa_bad_cast();
    }
    memcpy(&local_408,geom,200);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_408;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_c90,__l,
               (allocator_type *)&local_11b8);
    amrex::BoxArray::BoxArray((BoxArray *)&local_720,bxs);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_720;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_1050,__l_00,
               (allocator_type *)&local_ea8);
    local_1280.p = *(double **)
                    &(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.
                     m_ref.
                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ;
    local_1280.jstride =
         (Long)(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280.jstride)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280.jstride)->_M_use_count + 1;
      }
    }
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_1280;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               local_1348,__l_01,(allocator_type *)&local_e68);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_1228;
    local_1228.p = (double *)pFVar4;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_12e8,__l_02,(allocator_type *)&local_1074);
    amrex::MLEBABecLap::MLEBABecLap
              ((MLEBABecLap *)local_af8,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_c90,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_1050,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               local_1348,&local_ec8,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_12e8,nComp);
    if (local_12e8.p != (double *)0x0) {
      operator_delete(local_12e8.p,local_12e8.kstride - (long)local_12e8.p);
    }
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               local_1348);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1280.jstride);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_1050);
    amrex::BoxArray::~BoxArray((BoxArray *)&local_720);
    pvVar3 = (void *)CONCAT44(local_c90._4_4_,local_c90._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,local_c90._16_8_ - (long)pvVar3);
    }
    local_acc = max_order;
    amrex::MLMG::MLMG(&local_720,(MLLinOp *)local_af8);
    local_1074.do_semicoarsening = false;
    local_1074.agg_grid_size = -1;
    local_1074.con_grid_size = -1;
    local_1074.has_metric_term = true;
    local_1074.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_1074.max_coarsening_level = 0x1e;
    local_1074.max_semicoarsening_level = 0;
    local_1074.semicoarsening_direction = -1;
    local_1074.hidden_direction = -1;
    local_1074.do_consolidation = (anonymous_namespace)::consolidation != 0;
    local_720.verbose = verbose;
    memcpy((iterator)local_c90,geom,200);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)local_c90;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_1348,__l_03,
               (allocator_type *)&local_e68);
    amrex::BoxArray::BoxArray((BoxArray *)local_1050,bxs);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)local_1050;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_12e8,__l_04,
               (allocator_type *)&local_116c);
    local_11b8.p = *(double **)
                    &(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.
                     m_ref.
                     super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ;
    local_11b8.jstride =
         (Long)(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8.jstride)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8.jstride)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8.jstride)->_M_use_count + 1;
      }
    }
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&local_11b8;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1280,__l_05,&local_12e9);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_ea8;
    local_ea8.p = (double *)pFVar4;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_1228,__l_06,&local_12ea);
    amrex::MLEBABecLap::MLEBABecLap
              (&local_408,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_1348,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_12e8,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1280,&local_1074,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_1228,nComp);
    if ((FabArray<amrex::FArrayBox> *)local_1228.p != (FabArray<amrex::FArrayBox> *)0x0) {
      operator_delete(local_1228.p,local_1228.kstride - (long)local_1228.p);
    }
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1280);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8.jstride !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8.jstride);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_12e8);
    amrex::BoxArray::~BoxArray((BoxArray *)local_1050);
    if ((pointer)local_1348._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1348._0_8_,local_1348._16_8_ - local_1348._0_8_);
    }
    local_408.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder = max_order;
    local_12f8 = pFVar4;
    amrex::MLMG::MLMG((MLMG *)local_c90,(MLLinOp *)&local_408);
    local_c74 = (anonymous_namespace)::max_fmg_iter;
    local_c90._0_4_ = verbose;
    setDomainBC(&local_e1c,&local_e28,bc);
    amrex::MLLinOp::setDomainBC((MLLinOp *)local_af8,&local_e1c,&local_e28);
    amrex::MLLinOp::setDomainBC((MLLinOp *)&local_408,&local_e1c,&local_e28);
    if (verbose != 0) {
      local_1050._8_8_ = amrex::OutStream();
      poVar1 = (ostringstream *)(local_1050 + 0x10);
      local_1050._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_1050._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      *(undefined8 *)
       ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1050._16_8_ + -0x18))->_M_pi[1]
               ._M_use_count + (long)local_1050) =
           *(undefined8 *)
            ((ostream *)(local_1050._8_8_ + 8) + *(long *)(*(long *)local_1050._8_8_ + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"diffusing of ",0xd);
      std::ostream::operator<<(poVar1,nComp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," scalars \n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"rho flag ",9);
      std::ostream::operator<<(poVar1,rho_flag);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      amrex::Print::~Print((Print *)local_1050);
    }
    local_12f0 = Rho_comp;
    dVar28 = curr_time - prev_time;
    if (bVar27 && add_old_time_divFlux) {
      if (verbose != 0) {
        local_1050._8_8_ = amrex::OutStream();
        local_1050._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
        local_1050._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1050 + 0x10));
        *(undefined8 *)
         ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1050._16_8_ + -0x18))->_M_pi
                 [1]._M_use_count + (long)local_1050) =
             *(undefined8 *)
              ((ostream *)(local_1050._8_8_ + 8) + *(long *)(*(long *)local_1050._8_8_ + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1050 + 0x10),"Adding old time diff ...\n",0x19);
        amrex::Print::~Print((Print *)local_1050);
      }
      if (8 < local_1240) {
        amrex::MultiFab::Copy
                  ((MultiFab *)this_00,
                   (S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[1],(int)local_1300,0,nComp,0);
        if (rho_flag == 2) {
          amrex::MFIter::MFIter((MFIter *)local_1050,(FabArrayBase *)this_00,true);
          if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
            do {
              amrex::MFIter::tilebox((Box *)&local_1280,(MFIter *)local_1050);
              amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_1348,this_00,(MFIter *)local_1050);
              amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_12e8,
                         &(local_11e0->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[1]->
                          super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,Rho_comp);
              if ((int)local_1280.jstride <= local_1280.kstride._4_4_) {
                local_13f0 = (DistributionMapping *)(local_1280.jstride & 0xffffffff);
                do {
                  if (local_1280.p._4_4_ <= (int)local_1280.kstride) {
                    pdVar25 = (double *)
                              (local_1348._0_8_ +
                              ((long)(int)local_13f0 - (long)local_1320) * local_1348._16_8_ * 8 +
                              ((long)local_1280.p._4_4_ - (long)local_1328._4_4_) *
                              local_1348._8_8_ * 8 + (long)(int)local_1280.p * 8 +
                              (long)(int)local_1328 * -8);
                    lVar16 = (long)local_1280.p._4_4_;
                    do {
                      if ((int)local_1280.p <= local_1280.jstride._4_4_) {
                        pdVar18 = pdVar25;
                        lVar19 = (long)(int)local_1280.p;
                        do {
                          if (0 < nComp) {
                            dVar29 = local_12e8.p
                                     [((long)(int)local_13f0 - (long)local_12e8.begin.z) *
                                      local_12e8.kstride +
                                      (lVar16 - local_12e8.begin.y) * local_12e8.jstride +
                                      (lVar19 - local_12e8.begin.x)];
                            pdVar5 = pdVar18;
                            uVar22 = (ulong)(uint)nComp;
                            do {
                              *pdVar5 = *pdVar5 * (1.0 / dVar29);
                              pdVar5 = pdVar5 + (long)pbStack_1330;
                              uVar22 = uVar22 - 1;
                            } while (uVar22 != 0);
                          }
                          lVar19 = lVar19 + 1;
                          pdVar18 = pdVar18 + 1;
                        } while (local_1280.jstride._4_4_ + 1 != (int)lVar19);
                      }
                      lVar16 = lVar16 + 1;
                      pdVar25 = pdVar25 + local_1348._8_8_;
                    } while ((int)local_1280.kstride + 1 != (int)lVar16);
                  }
                  bVar27 = (int)local_13f0 != local_1280.kstride._4_4_;
                  local_13f0 = (DistributionMapping *)(ulong)((int)local_13f0 + 1);
                } while (bVar27);
              }
              amrex::MFIter::operator++((MFIter *)local_1050);
            } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
          }
          amrex::MFIter::~MFIter((MFIter *)local_1050);
        }
        amrex::MLLinOp::setCoarseFineBC((MLLinOp *)local_af8,(MultiFab *)this_00,cratio->vect[0]);
      }
      amrex::MultiFab::Copy
                ((MultiFab *)&local_e10,
                 *(S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(int)local_1300,0,nComp,1);
      if (rho_flag == 2) {
        amrex::MFIter::MFIter((MFIter *)local_1050,&local_e10.super_FabArrayBase,true);
        if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
          do {
            amrex::MFIter::growntilebox((Box *)&local_1280,(MFIter *)local_1050,1);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_1348,&local_e10,(MFIter *)local_1050);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_12e8,
                       &(*(local_11e0->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,Rho_comp);
            if ((int)local_1280.jstride <= local_1280.kstride._4_4_) {
              local_13f0 = (DistributionMapping *)(local_1280.jstride & 0xffffffff);
              do {
                if (local_1280.p._4_4_ <= (int)local_1280.kstride) {
                  pdVar25 = (double *)
                            (local_1348._0_8_ +
                            ((long)(int)local_13f0 - (long)local_1320) * local_1348._16_8_ * 8 +
                            ((long)local_1280.p._4_4_ - (long)local_1328._4_4_) *
                            local_1348._8_8_ * 8 + (long)(int)local_1280.p * 8 +
                            (long)(int)local_1328 * -8);
                  lVar16 = (long)local_1280.p._4_4_;
                  do {
                    if ((int)local_1280.p <= local_1280.jstride._4_4_) {
                      pdVar18 = pdVar25;
                      lVar19 = (long)(int)local_1280.p;
                      do {
                        if (0 < nComp) {
                          dVar29 = local_12e8.p
                                   [((long)(int)local_13f0 - (long)local_12e8.begin.z) *
                                    local_12e8.kstride +
                                    (lVar16 - local_12e8.begin.y) * local_12e8.jstride +
                                    (lVar19 - local_12e8.begin.x)];
                          pdVar5 = pdVar18;
                          uVar22 = (ulong)(uint)nComp;
                          do {
                            *pdVar5 = *pdVar5 * (1.0 / dVar29);
                            pdVar5 = pdVar5 + (long)pbStack_1330;
                            uVar22 = uVar22 - 1;
                          } while (uVar22 != 0);
                        }
                        lVar19 = lVar19 + 1;
                        pdVar18 = pdVar18 + 1;
                      } while (local_1280.jstride._4_4_ + 1 != (int)lVar19);
                    }
                    lVar16 = lVar16 + 1;
                    pdVar25 = pdVar25 + local_1348._8_8_;
                  } while ((int)local_1280.kstride + 1 != (int)lVar16);
                }
                bVar27 = (int)local_13f0 != local_1280.kstride._4_4_;
                local_13f0 = (DistributionMapping *)(ulong)((int)local_13f0 + 1);
              } while (bVar27);
            }
            amrex::MFIter::operator++((MFIter *)local_1050);
          } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
        }
        amrex::MFIter::~MFIter((MFIter *)local_1050);
      }
      amrex::MLCellLinOp::setLevelBC
                ((MLCellLinOp *)local_af8,0,(MultiFab *)&local_e10,(MultiFab *)0x0,(MultiFab *)0x0,
                 (MultiFab *)0x0);
      dVar29 = -(1.0 - local_12a8) * dVar28;
      amrex::MLEBABecLap::setScalars((MLEBABecLap *)local_af8,0.0,dVar29);
      setBeta((MLEBABecLap *)local_af8,betan,betaComp,nComp);
      local_1348._0_8_ = (pointer)0x1;
      local_1348._8_8_ = (pointer)0x0;
      local_1348._16_8_ = (pointer)0x0;
      pbStack_1330 = (pointer)0x0;
      local_1328 = (pointer)0x0;
      amrex::MultiFab::MultiFab
                ((MultiFab *)local_1050,bxs,dm,nComp,2,(MFInfo *)local_1348,
                 (FabFactory<amrex::FArrayBox> *)
                 factory.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1348 + 0x10));
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)local_1050,0.0,0,local_f84,
                 (IntVect *)(local_1050 + 0xc0));
      __l_07._M_len = 1;
      __l_07._M_array = (iterator)&local_1280;
      local_1280.p = (double *)local_1050;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1348,__l_07,
                 (allocator_type *)&local_11b8);
      __l_08._M_len = 1;
      __l_08._M_array = (iterator)&local_1228;
      local_1228.p = (double *)&local_e10;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_12e8,__l_08
                 ,(allocator_type *)&local_ea8);
      amrex::MLMG::apply(&local_720,
                         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1348
                         ,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          &local_12e8);
      pFVar4 = local_12f8;
      if (local_12e8.p != (double *)0x0) {
        operator_delete(local_12e8.p,local_12e8.kstride - (long)local_12e8.p);
      }
      if ((pointer)local_1348._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1348._0_8_,local_1348._16_8_ - local_1348._0_8_);
      }
      pMVar6 = amrex::EBDataCollection::getVolFrac
                         ((EBDataCollection *)
                          (((FabArray<amrex::FArrayBox> *)&pFVar4->super_FabArrayBase)->
                          super_FabArrayBase).m_bdkey.m_dm_id.data);
      amrex::single_level_weighted_redistribute
                ((MultiFab *)local_1050,(MultiFab *)&local_588,pMVar6,0,nComp,geom);
      computeExtensiveFluxes
                (&local_720,(MultiFab *)&local_e10,fluxn,fluxComp,nComp,
                 (MultiFab *)&local_11c8->navier_stokes->field_0x540,-dVar29 / dVar28);
      amrex::MultiFab::~MultiFab((MultiFab *)local_1050);
    }
    else {
      lVar16 = 0;
      do {
        local_1050._0_8_ =
             (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
        local_1050._8_8_ = local_1050._8_8_ & 0xffffffff00000000;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxn[lVar16]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,
                   (IntVect *)local_1050);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&local_588,0.0,0,local_588.super_FabArrayBase.n_comp,
                 &local_588.super_FabArrayBase.n_grow);
    }
    amrex::MFIter::MFIter
              ((MFIter *)local_1050,
               (FabArrayBase *)
               *(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,true);
    local_11d0 = rho_half;
    if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
      local_1148 = (ulong)(uint)nComp;
      do {
        amrex::MFIter::tilebox(&local_116c,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_1348,&local_588,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_12e8,&local_e10,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1280,
                   &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,(int)local_1300);
        if (rho_flag == 1) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1228,&rho_half->super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050);
        }
        else {
          local_1228.kstride = 0;
          local_1228.nstride = 0;
          local_1228.p = (double *)0x0;
          local_1228.jstride = 0;
          local_1228.begin.x = 1;
          local_1228.begin.y = 1;
          local_1228.begin.z = 1;
          local_1228.end.x = 0;
          local_1228.end.y = 0;
          local_1228.end.z = 0;
          local_1228.ncomp = 0;
        }
        if (rho_flag == 3) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_11b8,
                     &(*(local_11e0->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1050,Rho_comp);
        }
        else {
          local_11b8.kstride = 0;
          local_11b8.nstride = 0;
          local_11b8.p = (double *)0x0;
          local_11b8.jstride = 0;
          local_11b8.begin.x = 1;
          local_11b8.begin.y = 1;
          local_11b8.begin.z = 1;
          local_11b8.end.x = 0;
          local_11b8.end.y = 0;
          local_11b8.end.z = 0;
          local_11b8.ncomp = 0;
        }
        if (alpha_in == (MultiFab *)0x0) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_ea8,&local_e10,(MFIter *)local_1050);
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_ea8,&alpha_in->super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,
                     alpha_in_comp);
        }
        if (delta_rhs == (MultiFab *)0x0) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_e68,&local_e10,(MFIter *)local_1050);
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_e68,&delta_rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_1050,
                     rhsComp);
        }
        if (0 < nComp) {
          local_12f8 = (FabArray<amrex::FArrayBox> *)(long)local_116c.smallend.vect[1];
          lVar16 = (long)local_116c.smallend.vect[0];
          local_1090 = (FabArray<amrex::FArrayBox> *)local_1228.p;
          local_1080 = ((long)local_12f8 - (long)local_1228.begin.y) * local_1228.jstride * 8 +
                       lVar16 * 8 + (long)local_1228.begin.x * -8 + (long)local_1228.p;
          local_1098 = (long)local_1228.begin.z;
          local_10a0 = -local_1098;
          local_1290 = ((long)local_12f8 - (long)local_1328._4_4_) * local_1348._8_8_ * 8 +
                       lVar16 * 8 + (long)(int)local_1328 * -8 + local_1348._0_8_;
          local_1128 = (long)pbStack_1330 * 8;
          local_10a8 = local_1348._16_8_ * 8;
          local_10b0 = -(long)local_1320;
          local_1088 = ((long)local_12f8 - (long)local_ea8.begin.y) * local_ea8.jstride * 8 +
                       lVar16 * 8 + (long)local_ea8.begin.x * -8 + (long)local_ea8.p;
          local_10b8 = local_ea8.kstride * 8;
          local_1298 = ((long)local_12f8 - (long)local_12e8.begin.y) * local_12e8.jstride * 8 +
                       lVar16 * 8 + (long)local_12e8.begin.x * -8 + (long)local_12e8.p;
          local_10c0 = -(long)local_ea8.begin.z;
          local_1130 = local_12e8.nstride * 8;
          local_10c8 = local_12e8.kstride * 8;
          local_12a0 = ((long)local_12f8 - (long)local_1280.begin.y) * local_1280.jstride * 8 +
                       lVar16 * 8 + (long)local_1280.begin.x * -8 + (long)local_1280.p;
          local_10d0 = -(long)local_12e8.begin.z;
          local_1138 = local_1280.nstride * 8;
          local_10d8 = CONCAT44(local_1280.kstride._4_4_,(int)local_1280.kstride) * 8;
          local_11c0 = ((long)local_12f8 - (long)local_e68.begin.y) * local_e68.jstride * 8 +
                       lVar16 * 8 + (long)local_e68.begin.x * -8 + (long)local_e68.p;
          local_10e0 = -(long)local_1280.begin.z;
          local_1140 = local_e68.nstride * 8;
          local_10e8 = local_e68.kstride * 8;
          local_10f0 = -(long)local_e68.begin.z;
          local_1100 = local_11b8.p;
          local_1108 = local_11b8.kstride;
          local_1110 = (long)local_11b8.begin.z;
          local_122c = local_116c.smallend.vect[2];
          local_1288 = (FabArray<amrex::FArrayBox> *)
                       CONCAT44(local_1288._4_4_,local_116c.bigend.vect[2]);
          local_1238 = (double *)(ulong)(uint)local_116c.bigend.vect[1];
          local_10f8 = local_1228.kstride;
          local_1118 = local_1228.kstride * 8;
          uVar22 = 0;
          do {
            local_1120 = uVar22;
            iVar9 = local_116c.smallend.vect[2];
            if (local_116c.smallend.vect[2] <= local_116c.bigend.vect[2]) {
              do {
                if (local_116c.smallend.vect[1] <= local_116c.bigend.vect[1]) {
                  lVar14 = (long)iVar9;
                  lVar19 = (local_10a0 + lVar14) * local_1118 + local_1080;
                  lVar8 = (local_10b0 + lVar14) * local_10a8 + local_1290;
                  lVar12 = (local_10c0 + lVar14) * local_10b8 + local_1088;
                  lVar20 = (local_10d0 + lVar14) * local_10c8 + local_1298;
                  lVar23 = (local_10e0 + lVar14) * local_10d8 + local_12a0;
                  lVar11 = (local_10f0 + lVar14) * local_10e8 + local_11c0;
                  pFVar4 = local_12f8;
                  do {
                    if (local_116c.smallend.vect[0] <= local_116c.bigend.vect[0]) {
                      lVar26 = 0;
                      lVar10 = lVar16;
                      do {
                        if (delta_rhs != (MultiFab *)0x0) {
                          dVar29 = *(double *)(lVar11 + lVar26 * 8) * dVar28 +
                                   *(double *)(lVar8 + lVar26 * 8);
                          *(double *)(lVar8 + lVar26 * 8) = dVar29;
                          if (rho_flag == 1) {
                            *(double *)(lVar8 + lVar26 * 8) =
                                 dVar29 * *(double *)(lVar19 + lVar26 * 8);
                          }
                        }
                        dVar29 = *(double *)(lVar23 + lVar26 * 8);
                        *(double *)(lVar20 + lVar26 * 8) = dVar29;
                        lVar15 = (long)local_1228.begin.x;
                        ppp_Var17 = &(((FabArray<amrex::FArrayBox> *)local_1228.p)->
                                     super_FabArrayBase)._vptr_FabArrayBase +
                                    ((long)pFVar4 - (long)local_1228.begin.y) * local_1228.jstride +
                                    (iVar9 - local_1228.begin.z) * local_1228.kstride;
                        if ((rho_flag == 1) ||
                           (lVar15 = (long)local_11b8.begin.x,
                           ppp_Var17 = (_func_int ***)
                                       (local_11b8.p +
                                       (lVar14 - local_1110) * local_11b8.kstride +
                                       ((long)pFVar4 - (long)local_11b8.begin.y) *
                                       local_11b8.jstride), rho_flag == 3)) {
                          *(double *)(lVar20 + lVar26 * 8) =
                               dVar29 * (double)ppp_Var17[lVar10 - lVar15];
                        }
                        if (alpha_in != (MultiFab *)0x0) {
                          *(double *)(lVar20 + lVar26 * 8) =
                               *(double *)(lVar12 + lVar26 * 8) * *(double *)(lVar20 + lVar26 * 8);
                        }
                        *(double *)(lVar8 + lVar26 * 8) =
                             *(double *)(lVar20 + lVar26 * 8) + *(double *)(lVar8 + lVar26 * 8);
                        lVar10 = lVar10 + 1;
                        lVar26 = lVar26 + 1;
                      } while ((local_116c.bigend.vect[0] - local_116c.smallend.vect[0]) + 1 !=
                               (int)lVar26);
                    }
                    pFVar4 = (FabArray<amrex::FArrayBox> *)
                             ((long)&(((FabArray<amrex::FArrayBox> *)&pFVar4->super_FabArrayBase)->
                                     super_FabArrayBase)._vptr_FabArrayBase + 1);
                    lVar19 = lVar19 + local_1228.jstride * 8;
                    lVar8 = lVar8 + local_1348._8_8_ * 8;
                    lVar12 = lVar12 + local_ea8.jstride * 8;
                    lVar20 = lVar20 + local_12e8.jstride * 8;
                    lVar23 = lVar23 + local_1280.jstride * 8;
                    lVar11 = lVar11 + local_e68.jstride * 8;
                  } while (local_116c.bigend.vect[1] + 1U != (int)pFVar4);
                }
                bVar27 = iVar9 != local_116c.bigend.vect[2];
                iVar9 = iVar9 + 1;
              } while (bVar27);
            }
            local_1290 = local_1290 + local_1128;
            local_1298 = local_1298 + local_1130;
            local_12a0 = local_12a0 + local_1138;
            local_11c0 = local_11c0 + local_1140;
            uVar22 = local_1120 + 1;
          } while (local_1120 + 1 != local_1148);
        }
        amrex::MFIter::operator++((MFIter *)local_1050);
      } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1050);
    if (8 < local_1240) {
      amrex::MFIter::MFIter((MFIter *)local_1050,(FabArrayBase *)this_00,true);
      if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
        do {
          amrex::MFIter::tilebox((Box *)&local_1228,(MFIter *)local_1050);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_1348,this_00,(MFIter *)local_1050);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_12e8,
                     &(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1050,(int)local_1300);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&local_1280,
                     &(local_11e8->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1050,Rho_comp);
          if ((int)local_1228.jstride <= local_1228.kstride._4_4_) {
            local_1288 = (FabArray<amrex::FArrayBox> *)local_1280.p;
            lVar16 = (long)(int)local_1228.p;
            local_1290 = lVar16 * 8 + (long)(int)local_1328 * -8 + local_1348._0_8_;
            local_1238 = local_12e8.p + (lVar16 - local_12e8.begin.x);
            local_12f8 = (FabArray<amrex::FArrayBox> *)-(long)local_12e8.begin.z;
            local_1298 = CONCAT44(local_1280.kstride._4_4_,(int)local_1280.kstride);
            local_12a0 = (long)local_1280.begin.z;
            local_13e0 = local_1228.jstride & 0xffffffff;
            do {
              if (local_1228.p._4_4_ <= (int)local_1228.kstride) {
                lVar19 = (long)(int)local_13e0;
                iVar9 = local_1228.p._4_4_;
                do {
                  if ((int)local_1228.p <= local_1228.jstride._4_4_) {
                    lVar11 = (long)iVar9;
                    pdVar18 = (double *)
                              ((lVar11 - local_1328._4_4_) * local_1348._8_8_ * 8 +
                              (lVar19 - local_1320) * local_1348._16_8_ * 8 + local_1290);
                    pdVar25 = (double *)
                              ((long)local_1238 +
                              (lVar11 - local_12e8.begin.y) * local_12e8.jstride * 8 +
                              ((long)&(((FabArray<amrex::FArrayBox> *)
                                       &local_12f8->super_FabArrayBase)->super_FabArrayBase).
                                      _vptr_FabArrayBase + lVar19) * local_12e8.kstride * 8);
                    lVar8 = lVar16;
                    do {
                      pdVar5 = pdVar25;
                      pdVar21 = pdVar18;
                      uVar22 = (ulong)(uint)nComp;
                      if (0 < nComp) {
                        do {
                          *pdVar21 = *pdVar5;
                          pdVar21 = pdVar21 + (long)pbStack_1330;
                          pdVar5 = pdVar5 + local_12e8.nstride;
                          uVar22 = uVar22 - 1;
                        } while (uVar22 != 0);
                      }
                      if ((rho_flag == 2) && (0 < nComp)) {
                        dVar29 = *(double *)
                                  ((long)local_1280.p +
                                  (lVar8 - local_1280.begin.x) * 8 +
                                  (lVar11 - local_1280.begin.y) * local_1280.jstride * 8 +
                                  (lVar19 - local_12a0) * local_1298 * 8);
                        uVar22 = (ulong)(uint)nComp;
                        pdVar5 = pdVar18;
                        do {
                          *pdVar5 = *pdVar5 * (1.0 / dVar29);
                          pdVar5 = pdVar5 + (long)pbStack_1330;
                          uVar22 = uVar22 - 1;
                        } while (uVar22 != 0);
                      }
                      lVar8 = lVar8 + 1;
                      pdVar18 = pdVar18 + 1;
                      pdVar25 = pdVar25 + 1;
                    } while (local_1228.jstride._4_4_ + 1 != (int)lVar8);
                  }
                  bVar27 = iVar9 != (int)local_1228.kstride;
                  iVar9 = iVar9 + 1;
                } while (bVar27);
              }
              bVar27 = (int)local_13e0 != local_1228.kstride._4_4_;
              local_13e0 = (ulong)((int)local_13e0 + 1);
            } while (bVar27);
          }
          amrex::MFIter::operator++((MFIter *)local_1050);
        } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
      }
      amrex::MFIter::~MFIter((MFIter *)local_1050);
      amrex::MLLinOp::setCoarseFineBC((MLLinOp *)&local_408,(MultiFab *)this_00,cratio->vect[0]);
    }
    amrex::MFIter::MFIter((MFIter *)local_1050,&local_e10.super_FabArrayBase,true);
    if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
      do {
        amrex::MFIter::growntilebox((Box *)&local_1228,(MFIter *)local_1050,1);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_1348,&local_e10,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_12e8,
                   &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,(int)local_1300);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_1280,
                   &(*(local_11e8->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,Rho_comp);
        if ((int)local_1228.jstride <= local_1228.kstride._4_4_) {
          local_1288 = (FabArray<amrex::FArrayBox> *)local_1280.p;
          lVar16 = (long)(int)local_1228.p;
          local_1290 = lVar16 * 8 + (long)(int)local_1328 * -8 + local_1348._0_8_;
          local_1238 = local_12e8.p + (lVar16 - local_12e8.begin.x);
          local_12f8 = (FabArray<amrex::FArrayBox> *)-(long)local_12e8.begin.z;
          local_1298 = CONCAT44(local_1280.kstride._4_4_,(int)local_1280.kstride);
          local_12a0 = (long)local_1280.begin.z;
          local_13e0 = local_1228.jstride & 0xffffffff;
          do {
            if (local_1228.p._4_4_ <= (int)local_1228.kstride) {
              lVar19 = (long)(int)local_13e0;
              iVar9 = local_1228.p._4_4_;
              do {
                if ((int)local_1228.p <= local_1228.jstride._4_4_) {
                  lVar11 = (long)iVar9;
                  pdVar25 = (double *)
                            ((lVar11 - local_1328._4_4_) * local_1348._8_8_ * 8 +
                            (lVar19 - local_1320) * local_1348._16_8_ * 8 + local_1290);
                  pdVar18 = (double *)
                            ((long)local_1238 +
                            (lVar11 - local_12e8.begin.y) * local_12e8.jstride * 8 +
                            ((long)&(((FabArray<amrex::FArrayBox> *)&local_12f8->super_FabArrayBase)
                                    ->super_FabArrayBase)._vptr_FabArrayBase + lVar19) *
                            local_12e8.kstride * 8);
                  lVar8 = lVar16;
                  do {
                    pdVar5 = pdVar18;
                    pdVar21 = pdVar25;
                    uVar22 = (ulong)(uint)nComp;
                    if (0 < nComp) {
                      do {
                        *pdVar21 = *pdVar5;
                        pdVar21 = pdVar21 + (long)pbStack_1330;
                        pdVar5 = pdVar5 + local_12e8.nstride;
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                    if ((rho_flag == 2) && (0 < nComp)) {
                      dVar29 = *(double *)
                                ((long)local_1280.p +
                                (lVar8 - local_1280.begin.x) * 8 +
                                (lVar11 - local_1280.begin.y) * local_1280.jstride * 8 +
                                (lVar19 - local_12a0) * local_1298 * 8);
                      uVar22 = (ulong)(uint)nComp;
                      pdVar5 = pdVar25;
                      do {
                        *pdVar5 = *pdVar5 * (1.0 / dVar29);
                        pdVar5 = pdVar5 + (long)pbStack_1330;
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                    lVar8 = lVar8 + 1;
                    pdVar25 = pdVar25 + 1;
                    pdVar18 = pdVar18 + 1;
                  } while (local_1228.jstride._4_4_ + 1 != (int)lVar8);
                }
                bVar27 = iVar9 != (int)local_1228.kstride;
                iVar9 = iVar9 + 1;
              } while (bVar27);
            }
            bVar27 = (int)local_13e0 != local_1228.kstride._4_4_;
            local_13e0 = (ulong)((int)local_13e0 + 1);
          } while (bVar27);
        }
        amrex::MFIter::operator++((MFIter *)local_1050);
      } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1050);
    amrex::MLCellLinOp::setLevelBC
              ((MLCellLinOp *)&local_408,0,(MultiFab *)&local_e10,(MultiFab *)0x0,(MultiFab *)0x0,
               (MultiFab *)0x0);
    local_12a8 = local_12a8 * dVar28;
    local_11b8.p = (double *)0x3ff0000000000000;
    local_1348._0_8_ = (pointer)0x0;
    local_1348._8_8_ = (pointer)0x0;
    amrex::MultiFab::MultiFab((MultiFab *)local_1050);
    pDVar13 = local_11c8;
    iVar9 = 0;
    if (rho_flag != 1) {
      local_11d0 = *(local_11e8->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                    ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      iVar9 = Rho_comp;
    }
    computeAlpha((MultiFab *)local_1050,(pair<double,_double> *)local_1348,1.0,local_12a8,
                 (Real *)&local_11b8,alpha_in,alpha_in_comp,rho_flag,local_11d0,iVar9);
    amrex::MLEBABecLap::setScalars(&local_408,(Real)local_1348._0_8_,(Real)local_1348._8_8_);
    amrex::MLEBABecLap::setACoeffs(&local_408,0,(MultiFab *)local_1050);
    amrex::MultiFab::~MultiFab((MultiFab *)local_1050);
    setBeta(&local_408,betanp1,betaComp,nComp);
    amrex::MultiFab::mult((MultiFab *)&local_588,(Real)local_11b8.p,0,nComp,0);
    a_tol_rel = visc_tol;
    a_tol_abs = get_scaled_abs_tol((MultiFab *)&local_588,visc_tol);
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&local_12e8;
    local_12e8.p = (double *)&local_e10;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1050,__l_09,
               (allocator_type *)&local_1228);
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&local_1280;
    local_1280.p = (double *)&local_588;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               local_1348,__l_10,(allocator_type *)&local_ea8);
    amrex::MLMG::solve((MLMG *)local_c90,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1050,
                       (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       local_1348,a_tol_rel,a_tol_abs,(char *)0x0);
    if ((pointer)local_1348._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1348._0_8_,local_1348._16_8_ - local_1348._0_8_);
    }
    if ((FabArrayBase *)local_1050._0_8_ != (FabArrayBase *)0x0) {
      operator_delete((void *)local_1050._0_8_,local_1050._16_8_ - local_1050._0_8_);
    }
    computeExtensiveFluxes
              ((MLMG *)local_c90,(MultiFab *)&local_e10,fluxnp1,fluxComp,nComp,
               (MultiFab *)&pDVar13->navier_stokes->field_0x540,local_12a8 / dVar28);
    amrex::MFIter::MFIter
              ((MFIter *)local_1050,
               (FabArrayBase *)
               *(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,true);
    if ((int)local_1050._32_4_ < (int)local_1050._40_4_) {
      if (rho_flag != 2) {
        local_12f0 = (int)local_1300;
      }
      do {
        amrex::MFIter::tilebox((Box *)&local_1228,(MFIter *)local_1050);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_1348,
                   &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,(int)local_1300);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_12e8,&local_e10,(MFIter *)local_1050);
        pVVar7 = S_new;
        if (rho_flag == 2) {
          pVVar7 = local_11e8;
        }
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_1280,
                   &(*(pVVar7->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1050,local_12f0);
        if (0 < nComp) {
          lVar16 = (long)local_1228.p._4_4_;
          lVar19 = (long)(int)local_1228.p;
          local_1388 = (lVar16 - local_1328._4_4_) * local_1348._8_8_ * 8 + lVar19 * 8 +
                       (long)(int)local_1328 * -8 + local_1348._0_8_;
          local_13e8 = (lVar16 - local_12e8.begin.y) * local_12e8.jstride * 8 + lVar19 * 8 +
                       (long)local_12e8.begin.x * -8 + (long)local_12e8.p;
          uVar22 = 0;
          do {
            iVar9 = (int)local_1228.jstride;
            if ((int)local_1228.jstride <= local_1228.kstride._4_4_) {
              do {
                if (local_1228.p._4_4_ <= (int)local_1228.kstride) {
                  lVar8 = (long)iVar9;
                  lVar12 = (long)local_1280.p +
                           (lVar8 - local_1280.begin.z) *
                           CONCAT44(local_1280.kstride._4_4_,(int)local_1280.kstride) * 8 +
                           (lVar16 - local_1280.begin.y) * local_1280.jstride * 8 + lVar19 * 8 +
                           (long)local_1280.begin.x * -8;
                  lVar14 = (lVar8 - local_1320) * local_1348._16_8_ * 8 + local_1388;
                  lVar11 = (lVar8 - local_12e8.begin.z) * local_12e8.kstride * 8 + local_13e8;
                  lVar8 = lVar16;
                  do {
                    if ((int)local_1228.p <= local_1228.jstride._4_4_) {
                      lVar20 = 0;
                      do {
                        dVar28 = *(double *)(lVar11 + lVar20 * 8);
                        *(double *)(lVar14 + lVar20 * 8) = dVar28;
                        if (rho_flag == 2) {
                          *(double *)(lVar14 + lVar20 * 8) =
                               dVar28 * *(double *)(lVar12 + lVar20 * 8);
                        }
                        lVar20 = lVar20 + 1;
                      } while ((local_1228.jstride._4_4_ - (int)local_1228.p) + 1 != (int)lVar20);
                    }
                    lVar8 = lVar8 + 1;
                    lVar12 = lVar12 + local_1280.jstride * 8;
                    lVar14 = lVar14 + local_1348._8_8_ * 8;
                    lVar11 = lVar11 + local_12e8.jstride * 8;
                  } while ((int)local_1228.kstride + 1 != (int)lVar8);
                }
                bVar27 = iVar9 != local_1228.kstride._4_4_;
                iVar9 = iVar9 + 1;
              } while (bVar27);
            }
            uVar22 = uVar22 + 1;
            local_1388 = local_1388 + (long)pbStack_1330 * 8;
            local_13e8 = local_13e8 + local_12e8.nstride * 8;
          } while (uVar22 != (uint)nComp);
        }
        amrex::MFIter::operator++((MFIter *)local_1050);
      } while ((int)local_1050._32_4_ < (int)local_1050._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1050);
    if (verbose != 0) {
      dVar28 = amrex::ParallelDescriptor::second();
      local_1050._8_8_ = amrex::OutStream();
      poVar1 = (ostringstream *)(local_1050 + 0x10);
      local_1050._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_1050._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      *(undefined8 *)
       ((long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1050._16_8_ + -0x18))->_M_pi[1]
               ._M_use_count + (long)local_1050) =
           *(undefined8 *)
            ((ostream *)(local_1050._8_8_ + 8) + *(long *)(*(long *)local_1050._8_8_ + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Diffusion::diffuse_scalar() time: ",0x22);
      std::ostream::_M_insert<double>(dVar28 - local_1150);
      local_1348[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1348,1);
      amrex::Print::~Print((Print *)local_1050);
    }
    amrex::MLMG::~MLMG((MLMG *)local_c90);
    amrex::MLEBABecLap::~MLEBABecLap(&local_408);
    amrex::MLMG::~MLMG(&local_720);
    amrex::MLEBABecLap::~MLEBABecLap((MLEBABecLap *)local_af8);
    (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[1])();
    amrex::MultiFab::~MultiFab((MultiFab *)&local_e10);
    amrex::MultiFab::~MultiFab((MultiFab *)&local_588);
  }
  return;
}

Assistant:

void
Diffusion::diffuse_scalar (const Vector<MultiFab*>&  S_old,
                           const Vector<MultiFab*>&  Rho_old,
                           Vector<MultiFab*>&        S_new,
                           const Vector<MultiFab*>&  Rho_new,
                           int                       S_comp,
                           int                       nComp,
                           int                       Rho_comp,
                           Real                      prev_time,
                           Real                      curr_time,
                           Real                      be_cn_theta,
                           const MultiFab&           rho_half,
                           int                       rho_flag,
                           MultiFab* const*          fluxn,
                           MultiFab* const*          fluxnp1,
                           int                       fluxComp,
                           MultiFab*                 delta_rhs,
                           int                       rhsComp,
                           const MultiFab*           alpha_in,
                           int                       alpha_in_comp,
                           const MultiFab* const*    betan,
                           const MultiFab* const*    betanp1,
                           int                       betaComp,
                           const IntVect&            cratio,
                           const BCRec&              bc,
                           const Geometry&           geom,
                           bool                      add_old_time_divFlux,
                           const amrex::Vector<int>& a_is_diffusive)
{
    //
    // This routine expects that physical BC's have been loaded into
    // the grow cells of the old and new state at this level.  If rho_flag==2,
    // the values there are rho.phi, where phi is the quantity being diffused.
    // Values in these cells will be preserved.  Also, if there are any
    // explicit update terms, these have already incremented the new state
    // on the valid region (i.e., on the valid region the new state is the old
    // state + dt*Div(explicit_fluxes), e.g.)
    //

    if (verbose)
      amrex::Print() << "... Diffusion::diffuse_scalar(): \n"
                     << " lev: " << level << '\n';

    // Velocity components should go to tensor solver
    if (S_comp <= Xvel && Xvel <= S_comp+nComp-1){
       amrex::Abort("Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n");
    }

    // Check if scalars are diffusive type:
    // all the nComp scalars must be of the same type
    int diffType = a_is_diffusive[0];
    for (int comp = 1; comp < nComp; comp++) {
        if (a_is_diffusive[comp] != diffType) {
            amrex::Abort("All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar");
        }
    }

    // If all non-diffusive, set flux to zero and exit
    if (diffType == 0) {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
            if (fluxn[idim]!= 0 && fluxnp1[idim]!= 0)
            {
                fluxn[idim]->setVal(0.0,fluxComp,nComp);
                fluxnp1[idim]->setVal(0.0,fluxComp,nComp);
            }
        }
        return;
    }

    bool has_coarse_data = S_new.size() > 1;

    const Real strt_time = ParallelDescriptor::second();

    int allthere, allnull;
    checkBeta(betan, allthere, allnull);
    checkBeta(betanp1, allthere);
    if (allnull && add_old_time_divFlux && be_cn_theta!=1)
       amrex::Abort("Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta.");

    //
    // No ghost cells are needed for MLMG in most cases. Except for
    // for cell-centered solver, you need to call setLevelBC, and that
    // needs to have 1 ghost cell if there is Dirichlet BC.
    //
    const int ng = 1;

    Real dt = curr_time - prev_time;
    AMREX_ASSERT(S_new[0]->nGrow()>0);
    if (S_old.size()>0) AMREX_ASSERT(S_old[0]->nGrow()>0);
    const BoxArray& ba = S_new[0]->boxArray();
    const DistributionMapping& dm = S_new[0]->DistributionMap();
    const DistributionMapping* dmc = (has_coarse_data ? &(S_new[1]->DistributionMap()) : 0);
    const BoxArray* bac = (has_coarse_data ? &(S_new[1]->boxArray()) : 0);

    const auto& factory = S_new[0]->Factory();

    MultiFab Rhs(ba,dm,nComp,0,MFInfo(),factory);
    MultiFab Soln(ba,dm,nComp,ng,MFInfo(),factory);

    auto Solnc = std::unique_ptr<MultiFab>(new MultiFab());
    if (has_coarse_data)
    {
      Solnc->define(*bac, *dmc, nComp, 0, MFInfo(), S_new[1]->Factory());
    }

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;

    //
    // Create operator at time n and n+1
    //
    LPInfo infon;
    infon.setAgglomeration(agglomeration);
    infon.setConsolidation(consolidation);
    infon.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
    const auto& ebf = &(dynamic_cast<EBFArrayBoxFactory const&>(factory));
    MLEBABecLap opn({geom}, {ba}, {dm}, infon, {ebf}, nComp);
#else
    MLABecLaplacian opn({geom}, {ba}, {dm}, infon, {}, nComp);
#endif

    opn.setMaxOrder(max_order);
    MLMG mgn(opn);
    mgn.setVerbose(verbose);

    LPInfo infonp1;
    infonp1.setAgglomeration(agglomeration);
    infonp1.setConsolidation(consolidation);

#ifdef AMREX_USE_EB
    MLEBABecLap opnp1({geom}, {ba}, {dm}, infonp1, {ebf}, nComp);
#else
    MLABecLaplacian opnp1({geom}, {ba}, {dm}, infonp1, {}, nComp);
#endif
    opnp1.setMaxOrder(max_order);

    MLMG mgnp1(opnp1);
    if (use_hypre)
    {
      mgnp1.setBottomSolver(MLMG::BottomSolver::hypre);
      mgnp1.setBottomVerbose(hypre_verbose);
    }
    mgnp1.setMaxFmgIter(max_fmg_iter);
    mgnp1.setVerbose(verbose);

    setDomainBC(mlmg_lobc, mlmg_hibc, bc); // Same for all comps, by assumption
    opn.setDomainBC(mlmg_lobc, mlmg_hibc);
    opnp1.setDomainBC(mlmg_lobc, mlmg_hibc);

    if (verbose)
    {
       amrex::Print() << "diffusing of " << nComp << " scalars \n"
                      << "rho flag "<< rho_flag << "\n";
    }

    int sigma = S_comp;

    if (add_old_time_divFlux && be_cn_theta!=1) {
        Real a = 0.0;
        Real b = -(1.0-be_cn_theta)*dt;

        if(verbose)
             Print()<<"Adding old time diff ...\n";

        {
            if (has_coarse_data) {
                MultiFab::Copy(*Solnc,*S_old[1],sigma,0,nComp,0);
                if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                    for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                    {
                        const Box& bx = mfi.tilebox();
                        auto const& sol_arr = Solnc->array(mfi);
                        auto const& rho_arr = Rho_old[1]->const_array(mfi,Rho_comp);
                        amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                        {
                            Real rhoInv = 1.0 / rho_arr(i,j,k);
                            for (int n = 0; n < nComp; ++n) {
                               sol_arr(i,j,k,n) *= rhoInv;
                            }
                        });
                    }
                }
                opn.setCoarseFineBC(Solnc.get(), cratio[0]);
            }
            MultiFab::Copy(Soln,*S_old[0],sigma,0,nComp,ng);
            if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ng);
                    auto const& sol_arr = Soln.array(mfi);
                    auto const& rho_arr = Rho_old[0]->const_array(mfi,Rho_comp);
                    amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                    AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                    {
                        Real rhoInv = 1.0 / rho_arr(i,j,k);
                        for (int n = 0; n < nComp; ++n) {
                           sol_arr(i,j,k,n) *= rhoInv;
                        }
                    });
                }
            }
            opn.setLevelBC(0, &Soln);
        }

        opn.setScalars(a,b);
        setBeta(opn,betan,betaComp,nComp);

#ifdef AMREX_USE_EB
        MultiFab rhs_tmp(ba,dm,nComp,2,MFInfo(),factory);
        rhs_tmp.setVal(0.);
        mgn.apply({&rhs_tmp},{&Soln});

        const amrex::MultiFab* weights;
        weights = &(ebf->getVolFrac());

        amrex::single_level_weighted_redistribute(rhs_tmp, Rhs, *weights, 0, nComp, geom);
#else
        mgn.apply({&Rhs},{&Soln});
#endif
        computeExtensiveFluxes(mgn, Soln, fluxn, fluxComp, nComp,
			       navier_stokes->area, -b/dt);
    } else {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
          fluxn[idim]->setVal(0.0,fluxComp,nComp);
        }
        Rhs.setVal(0.0);
    }

    // Get local version of the switch
    int has_alpha     = (alpha_in  != 0) ? 1 : 0;
    int has_delta_rhs = (delta_rhs != 0) ? 1 : 0;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& rhs      = Rhs.array(mfi);
        auto const& solution = Soln.array(mfi);
        auto const& snew     = S_new[0]->array(mfi,sigma);
        Array4<const Real> dummy;
        auto const& rhoHalf  = (rho_flag == 1) ? rho_half.const_array(mfi) : dummy;
        auto const& rho_old  = (rho_flag == 3) ? Rho_old[0]->const_array(mfi,Rho_comp) : dummy;
        auto const& alpha    = (has_alpha) ? alpha_in->const_array(mfi,alpha_in_comp) : Soln.const_array(mfi);
        auto const& deltarhs = (has_delta_rhs) ? delta_rhs->const_array(mfi,rhsComp) : Soln.const_array(mfi);
        amrex::ParallelFor(bx, nComp, [rhs, solution, snew, rhoHalf, rho_old, alpha, deltarhs,
                                has_alpha, has_delta_rhs, rho_flag, dt ]
        AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
        {
            // Add body sources
            if ( has_delta_rhs ) {
                rhs(i,j,k,n) += deltarhs(i,j,k,n) * dt;
                if ( rho_flag == 1 ) {
                    rhs(i,j,k,n) *= rhoHalf(i,j,k);
                }
            }
            // Always do : copy S_new into Soln
            //             add Soln to Rhs
            solution(i,j,k,n) = snew(i,j,k,n);
            if ( rho_flag == 1) {
                solution(i,j,k,n) *= rhoHalf(i,j,k);
            } else if ( rho_flag == 3 ) {
                solution(i,j,k,n) *= rho_old(i,j,k);
            }
            if ( has_alpha ) {
                solution(i,j,k,n) *= alpha(i,j,k);
            }
            rhs(i,j,k,n) += solution(i,j,k,n);
        });
    }

    //
    // Set C&F solutions, levelBCs and CoarseFineBCs
    //
    if (has_coarse_data) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto const& sol_arr  = Solnc->array(mfi);
            auto const& snew_arr = S_new[1]->const_array(mfi,sigma);
            auto const& rho_arr  = Rho_new[1]->const_array(mfi,Rho_comp);
            amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
            AMREX_GPU_DEVICE(int i, int j, int k) noexcept
            {
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
                }
                if (rho_flag == 2) {
                    Real rhoInv = 1.0 / rho_arr(i,j,k);
                    for (int n = 0; n < nComp; ++n) {
                       sol_arr(i,j,k,n) *= rhoInv;
                    }
                }
            });
        }
        opnp1.setCoarseFineBC(Solnc.get(), cratio[0]);
    }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        auto const& sol_arr  = Soln.array(mfi);
        auto const& snew_arr = S_new[0]->const_array(mfi,sigma);
        auto const& rho_arr  = Rho_new[0]->const_array(mfi,Rho_comp);
        amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
            for (int n = 0; n < nComp; ++n) {
               sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
            }
            if (rho_flag == 2) {
                Real rhoInv = 1.0 / rho_arr(i,j,k);
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) *= rhoInv;
                }
            }
        });
    }
    opnp1.setLevelBC(0, &Soln);

    Real a = 1.0;
    Real b = be_cn_theta*dt;
    Real rhsscale = 1.0;
    {
        std::pair<Real,Real> scalars;
        MultiFab alpha;
        const MultiFab* rho = (rho_flag == 1) ? &rho_half : Rho_new[0];
        int rhoComp = (rho_flag == 1 ) ? 0 : Rho_comp;

        computeAlpha(alpha, scalars, a, b,
                     &rhsscale, alpha_in, alpha_in_comp,
                     rho_flag, rho, rhoComp);
        opnp1.setScalars(scalars.first, scalars.second);
        opnp1.setACoeffs(0, alpha);
    }

    setBeta(opnp1,betanp1,betaComp,nComp);

    Rhs.mult(rhsscale,0,nComp);
    const Real S_tol     = visc_tol;
    const Real S_tol_abs = get_scaled_abs_tol(Rhs, visc_tol);

    mgnp1.solve({&Soln}, {&Rhs}, S_tol, S_tol_abs);

    computeExtensiveFluxes(mgnp1, Soln, fluxnp1, fluxComp, nComp,
			   navier_stokes->area, b/dt);

    //
    // Copy into state variable at new time, without bc's and * rho if needed
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       const auto& snew     = S_new[0]->array(mfi, sigma);
       const auto& solution = Soln.const_array(mfi);
       const auto& rhonew   = (rho_flag == 2) ? Rho_new[0]->const_array(mfi,Rho_comp) : S_new[0]->const_array(mfi,sigma);
       amrex::ParallelFor(bx, nComp, [snew, solution, rhonew, rho_flag]
       AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       {
          snew(i,j,k,n) = solution(i,j,k,n);
          if (rho_flag == 2) {
             snew(i,j,k,n) *= rhonew(i,j,k);
          }
       });
    }

    if (verbose) {
       const int IOProc   = ParallelDescriptor::IOProcessorNumber();
       Real      run_time = ParallelDescriptor::second() - strt_time;
       ParallelDescriptor::ReduceRealMax(run_time,IOProc);
       amrex::Print() << "Diffusion::diffuse_scalar() time: " << run_time << '\n';
    }
}